

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plutovg-path.c
# Opt level: O3

plutovg_path_t *
plutovg_path_clone_dashed(plutovg_path_t *path,float offset,float *dashes,int ndashes)

{
  plutovg_path_t *path_00;
  
  path_00 = (plutovg_path_t *)malloc(0x28);
  path_00->ref_count = 1;
  path_00->num_points = 0;
  path_00->num_contours = 0;
  path_00->num_curves = 0;
  (path_00->start_point).x = 0.0;
  *(undefined8 *)&(path_00->start_point).y = 0;
  *(undefined8 *)((long)&(path_00->elements).data + 4) = 0;
  (path_00->elements).capacity = 0;
  plutovg_path_reserve(path_00,path->num_curves * 0x20 + (path->elements).size);
  plutovg_path_traverse_dashed(path,offset,dashes,ndashes,clone_traverse_func,path_00);
  return path_00;
}

Assistant:

plutovg_path_t* plutovg_path_clone_dashed(const plutovg_path_t* path, float offset, const float* dashes, int ndashes)
{
    plutovg_path_t* clone = plutovg_path_create();
    plutovg_path_reserve(clone, path->elements.size + path->num_curves * 32);
    plutovg_path_traverse_dashed(path, offset, dashes, ndashes, clone_traverse_func, clone);
    return clone;
}